

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdrInv.c
# Opt level: O0

int Pdr_InvCheck_int(Gia_Man_t *p,Vec_Int_t *vInv,int fVerbose,sat_solver *pSat,int fSkip)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  uint *puVar6;
  Vec_Int_t *p_00;
  int *piVar7;
  int *piVar8;
  int iFiVarBeg;
  int iFoVarBeg;
  Vec_Int_t *vLits;
  int *pList;
  int *pCube;
  int nFailedOuts;
  int nFailed;
  int status;
  int k;
  int i;
  int fCheckProperty;
  int nBTLimit;
  int fSkip_local;
  sat_solver *pSat_local;
  int fVerbose_local;
  Vec_Int_t *vInv_local;
  Gia_Man_t *p_local;
  
  pCube._4_4_ = 0;
  pCube._0_4_ = 0;
  puVar6 = (uint *)Vec_IntArray(vInv);
  p_00 = Vec_IntAlloc(100);
  iVar1 = sat_solver_nvars(pSat);
  iVar2 = Gia_ManRegNum(p);
  iVar3 = Gia_ManPoNum(p);
  pList = (int *)(puVar6 + 1);
  for (status = 0; status < (int)*puVar6; status = status + 1) {
    Vec_IntClear(p_00);
    for (nFailed = 0; nFailed < *pList; nFailed = nFailed + 1) {
      if (pList[nFailed + 1] != -1) {
        iVar4 = Abc_Lit2Var(pList[nFailed + 1]);
        iVar5 = Abc_LitIsCompl(pList[nFailed + 1]);
        iVar4 = Abc_Var2Lit((iVar1 - iVar2) + iVar4,(uint)((iVar5 != 0 ^ 0xffU) & 1));
        Vec_IntPush(p_00,iVar4);
      }
    }
    iVar4 = Vec_IntSize(p_00);
    if (iVar4 == 0) {
      Vec_IntFree(p_00);
      return 1;
    }
    piVar7 = Vec_IntArray(p_00);
    piVar8 = Vec_IntLimit(p_00);
    iVar4 = sat_solver_addclause(pSat,piVar7,piVar8);
    if (iVar4 != 1) {
      __assert_fail("status == 1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/pdr/pdrInv.c"
                    ,0x2dc,"int Pdr_InvCheck_int(Gia_Man_t *, Vec_Int_t *, int, sat_solver *, int)")
      ;
    }
    pList = pList + (*pList + 1);
  }
  for (status = 0; iVar1 = Gia_ManPoNum(p), status < iVar1; status = status + 1) {
    iVar1 = Abc_Var2Lit(status + 1,0);
    Vec_IntFill(p_00,1,iVar1);
    piVar7 = Vec_IntArray(p_00);
    piVar8 = Vec_IntLimit(p_00);
    iVar1 = sat_solver_solve(pSat,piVar7,piVar8,0,0,0,0);
    if (iVar1 == 0) break;
    if (iVar1 == 1) {
      if (fVerbose != 0) {
        Abc_Print(1,"Coverage check failed for output %d.\n",(ulong)(uint)status);
      }
      pCube._0_4_ = (int)pCube + 1;
      if (fSkip != 0) {
        Vec_IntFree(p_00);
        return 1;
      }
    }
    else if (iVar1 != -1) {
      __assert_fail("status == l_False",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/pdr/pdrInv.c"
                    ,0x2f3,"int Pdr_InvCheck_int(Gia_Man_t *, Vec_Int_t *, int, sat_solver *, int)")
      ;
    }
  }
  pList = (int *)(puVar6 + 1);
  for (status = 0; status < (int)*puVar6; status = status + 1) {
    Vec_IntClear(p_00);
    for (nFailed = 0; nFailed < *pList; nFailed = nFailed + 1) {
      if (pList[nFailed + 1] != -1) {
        iVar1 = Abc_Lit2Var(pList[nFailed + 1]);
        iVar2 = Abc_LitIsCompl(pList[nFailed + 1]);
        iVar1 = Abc_Var2Lit(iVar3 + 1 + iVar1,iVar2);
        Vec_IntPush(p_00,iVar1);
      }
    }
    piVar7 = Vec_IntArray(p_00);
    piVar8 = Vec_IntLimit(p_00);
    iVar1 = sat_solver_solve(pSat,piVar7,piVar8,0,0,0,0);
    if ((iVar1 != 1) && (fVerbose != 0)) {
      Abc_Print(1,"Finished checking clause %d (out of %d)...\r",(ulong)(uint)status,(ulong)*puVar6)
      ;
    }
    if (iVar1 == 0) break;
    if (iVar1 != -1) {
      if (iVar1 != 1) {
        __assert_fail("status == l_True",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/pdr/pdrInv.c"
                      ,0x307,
                      "int Pdr_InvCheck_int(Gia_Man_t *, Vec_Int_t *, int, sat_solver *, int)");
      }
      if (fVerbose != 0) {
        Abc_Print(1,"Inductiveness check failed for clause %d.\n",(ulong)(uint)status);
      }
      pCube._4_4_ = pCube._4_4_ + 1;
      if (fSkip != 0) {
        Vec_IntFree(p_00);
        return 1;
      }
    }
    pList = pList + (*pList + 1);
  }
  Vec_IntFree(p_00);
  return pCube._4_4_ + (int)pCube;
}

Assistant:

int Pdr_InvCheck_int( Gia_Man_t * p, Vec_Int_t * vInv, int fVerbose, sat_solver * pSat, int fSkip )
{
    int nBTLimit = 0;
    int fCheckProperty = 1;
    int i, k, status, nFailed = 0, nFailedOuts = 0; 
    // collect cubes
    int * pCube, * pList = Vec_IntArray(vInv);
    // create variables
    Vec_Int_t * vLits = Vec_IntAlloc(100);
    int iFoVarBeg = sat_solver_nvars(pSat) - Gia_ManRegNum(p);
    int iFiVarBeg = 1 + Gia_ManPoNum(p);
    // add cubes
    Pdr_ForEachCube( pList, pCube, i )
    {
        // collect literals
        Vec_IntClear( vLits );
        for ( k = 0; k < pCube[0]; k++ )
            if ( pCube[k+1] != -1 )
                Vec_IntPush( vLits, Abc_Var2Lit(iFoVarBeg + Abc_Lit2Var(pCube[k+1]), !Abc_LitIsCompl(pCube[k+1])) );
        if ( Vec_IntSize(vLits) == 0 )
        {
            Vec_IntFree( vLits );
            return 1;
        }
        // add it to the solver
        status = sat_solver_addclause( pSat, Vec_IntArray(vLits), Vec_IntLimit(vLits) );
        assert( status == 1 );
    }
    // verify property output
    if ( fCheckProperty )
    {
        for ( i = 0; i < Gia_ManPoNum(p); i++ )
        {
            Vec_IntFill( vLits, 1, Abc_Var2Lit(1+i, 0) );
            status = sat_solver_solve( pSat, Vec_IntArray(vLits), Vec_IntLimit(vLits), nBTLimit, 0, 0, 0 );
            if ( status == l_Undef ) // timeout
                break;
            if ( status == l_True ) // sat - property fails
            {
                if ( fVerbose )
                    Abc_Print(1, "Coverage check failed for output %d.\n", i );
                nFailedOuts++;
                if ( fSkip )
                {
                    Vec_IntFree( vLits );
                    return 1;
                }
                continue;
            }
            assert( status == l_False ); // unsat - property holds
        }
    }
    // iterate through cubes in the direct order
    Pdr_ForEachCube( pList, pCube, i )
    {
        // collect cube
        Vec_IntClear( vLits );
        for ( k = 0; k < pCube[0]; k++ )
            if ( pCube[k+1] != -1 )
                Vec_IntPush( vLits, Abc_Var2Lit(iFiVarBeg + Abc_Lit2Var(pCube[k+1]), Abc_LitIsCompl(pCube[k+1])) );
        // check if this cube intersects with the complement of other cubes in the solver
        // if it does not intersect, then it is redundant and can be skipped
        status = sat_solver_solve( pSat, Vec_IntArray(vLits), Vec_IntLimit(vLits), nBTLimit, 0, 0, 0 );
        if ( status != l_True && fVerbose )
            Abc_Print(1, "Finished checking clause %d (out of %d)...\r", i, pList[0] );
        if ( status == l_Undef ) // timeout
            break;
        if ( status == l_False ) // unsat -- correct
            continue;
        assert( status == l_True );
        if ( fVerbose )
            Abc_Print(1, "Inductiveness check failed for clause %d.\n", i );
        nFailed++;
        if ( fSkip )
        {
            Vec_IntFree( vLits );
            return 1;
        }
    }
    Vec_IntFree( vLits );
    return nFailed + nFailedOuts;
}